

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O2

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CCompExp *expression)

{
  IExpression *pIVar1;
  ISubtreeWrapper IVar2;
  ISubtreeWrapper IVar3;
  TCompareOperation TVar4;
  ISubtreeWrapper *pIVar5;
  ISubtreeWrapper local_40;
  ISubtreeWrapper local_38;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> wrapperRight;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> wrapperLeft;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: CCompExp\n");
  pIVar1 = (expression->leftOperand)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  wrapperLeft._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
       )(this->wrapper)._M_t.
        super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t
        .super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
        super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  pIVar1 = (expression->rightOperand)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  wrapperRight._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
       )(this->wrapper)._M_t.
        super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t
        .super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
        super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  TVar4 = expression->operation;
  if (TVar4 == LESS) {
    pIVar5 = (ISubtreeWrapper *)operator_new(0x20);
    (*(code *)**(undefined8 **)
                wrapperLeft._M_t.
                super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                ._M_t.
                super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)(&local_40);
    IVar2._vptr_ISubtreeWrapper = local_40._vptr_ISubtreeWrapper;
    local_40._vptr_ISubtreeWrapper = (_func_int **)0x0;
    (*(code *)**(undefined8 **)
                wrapperRight._M_t.
                super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                ._M_t.
                super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)(&local_38);
    IVar3._vptr_ISubtreeWrapper = local_38._vptr_ISubtreeWrapper;
    local_38._vptr_ISubtreeWrapper = (_func_int **)0x0;
    pIVar5->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b548;
    *(undefined1 *)&pIVar5[1]._vptr_ISubtreeWrapper = 2;
    pIVar5[2]._vptr_ISubtreeWrapper = IVar2._vptr_ISubtreeWrapper;
    pIVar5[3]._vptr_ISubtreeWrapper = IVar3._vptr_ISubtreeWrapper;
    updateSubtreeWrapper(this,pIVar5);
    if (local_38._vptr_ISubtreeWrapper != (_func_int **)0x0) {
      (**(code **)(*local_38._vptr_ISubtreeWrapper + 0x10))();
    }
    if (local_40._vptr_ISubtreeWrapper != (_func_int **)0x0) {
      (**(code **)(*local_40._vptr_ISubtreeWrapper + 0x10))();
    }
    TVar4 = expression->operation;
  }
  if (TVar4 == GREATER) {
    pIVar5 = (ISubtreeWrapper *)operator_new(0x20);
    (*(code *)**(undefined8 **)
                wrapperLeft._M_t.
                super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                ._M_t.
                super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)(&local_40);
    IVar2._vptr_ISubtreeWrapper = local_40._vptr_ISubtreeWrapper;
    local_40._vptr_ISubtreeWrapper = (_func_int **)0x0;
    (*(code *)**(undefined8 **)
                wrapperRight._M_t.
                super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                ._M_t.
                super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)(&local_38);
    IVar3._vptr_ISubtreeWrapper = local_38._vptr_ISubtreeWrapper;
    local_38._vptr_ISubtreeWrapper = (_func_int **)0x0;
    pIVar5->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b548;
    *(undefined1 *)&pIVar5[1]._vptr_ISubtreeWrapper = 3;
    pIVar5[2]._vptr_ISubtreeWrapper = IVar2._vptr_ISubtreeWrapper;
    pIVar5[3]._vptr_ISubtreeWrapper = IVar3._vptr_ISubtreeWrapper;
    updateSubtreeWrapper(this,pIVar5);
    if (local_38._vptr_ISubtreeWrapper != (_func_int **)0x0) {
      (**(code **)(*local_38._vptr_ISubtreeWrapper + 0x10))();
    }
    if (local_40._vptr_ISubtreeWrapper != (_func_int **)0x0) {
      (**(code **)(*local_40._vptr_ISubtreeWrapper + 0x10))();
    }
  }
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            (&wrapperRight);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            (&wrapperLeft);
  return;
}

Assistant:

void CBuildVisitor::Visit( CCompExp &expression ) {
    std::cout << "IRT builder: CCompExp\n";
    expression.leftOperand->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperLeft = std::move( wrapper );

    expression.rightOperand->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperRight = std::move( wrapper );

    if ( expression.operation == enums::TCompareOperation::LESS ) {
        updateSubtreeWrapper( new IRT::CRelativeConditionalWrapper(
                IRT::enums::TLogicOperator::LESS,
                std::move( wrapperLeft->ToExpression( )),
                std::move( wrapperRight->ToExpression( ))
        ));
    }

    if ( expression.operation == enums::TCompareOperation::GREATER ) {
        updateSubtreeWrapper( new IRT::CRelativeConditionalWrapper(
                IRT::enums::TLogicOperator::GREATER,
                std::move( wrapperLeft->ToExpression( )),
                std::move( wrapperRight->ToExpression( ))
        ));
    }
}